

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

QTableWidgetItem * __thiscall QTableWidget::verticalHeaderItem(QTableWidget *this,int row)

{
  long lVar1;
  QTableWidgetItem *pQVar2;
  
  lVar1 = QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
  if ((ulong)(long)row < *(ulong *)(lVar1 + 0x40)) {
    pQVar2 = *(QTableWidgetItem **)(*(long *)(lVar1 + 0x38) + (long)row * 8);
  }
  else {
    pQVar2 = (QTableWidgetItem *)0x0;
  }
  return pQVar2;
}

Assistant:

QTableWidgetItem *QTableWidget::verticalHeaderItem(int row) const
{
    Q_D(const QTableWidget);
    return d->tableModel()->verticalHeaderItem(row);
}